

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

bool __thiscall
caffe::SPPParameter::MergePartialFromCodedStream(SPPParameter *this,CodedInputStream *input)

{
  uint tag_00;
  CodedInputStream *input_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  UnknownFieldSet *pUVar5;
  bool local_91;
  SPPParameter_Engine local_7c;
  SPPParameter_PoolMethod local_78;
  int value_1;
  int value;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  SPPParameter *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  unique0x100002ae = input;
LAB_007ac8cb:
  _first_byte_or_zero = stack0xffffffffffffff98;
  kMax1ByteVarint = 0x7f;
  tag_2 = 0;
  if ((stack0xffffffffffffff98->buffer_ < stack0xffffffffffffff98->buffer_end_) &&
     (tag_2 = (uint32)*stack0xffffffffffffff98->buffer_,
     '\0' < (char)*stack0xffffffffffffff98->buffer_)) {
    local_24 = 0x7f;
    kMax2ByteVarint = (uint32)*stack0xffffffffffffff98->buffer_;
    google::protobuf::io::CodedInputStream::Advance(stack0xffffffffffffff98,1);
    local_91 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
    tag_3._3_1_ = local_91;
    pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
    local_10 = pVar4.first;
    uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
  }
  else {
    local_3c[0] = google::protobuf::io::CodedInputStream::ReadTagFallback
                            (stack0xffffffffffffff98,tag_2);
    local_3d = local_3c[0] - 1 < kMax1ByteVarint;
    pVar4 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
    local_10 = pVar4.first;
    uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
  }
  value._0_1_ = (undefined1)uStack_c;
  value_1 = local_10;
  p.first = value_1;
  if ((uStack_c & 1) != 0) {
    iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
    if (iVar2 == 1) {
      if ((p.first & 0xff) != 8) goto LAB_007acc03;
      set_has_pyramid_height(this);
      bVar1 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                        (stack0xffffffffffffff98,&this->pyramid_height_);
      goto joined_r0x007acb29;
    }
    if (iVar2 == 2) {
      if ((p.first & 0xff) != 0x10) goto LAB_007acc03;
      bVar1 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                        (stack0xffffffffffffff98,(int *)&local_78);
      if (!bVar1) {
        return false;
      }
      bVar1 = SPPParameter_PoolMethod_IsValid(local_78);
      if (bVar1) {
        set_pool(this,local_78);
      }
      else {
        pUVar5 = mutable_unknown_fields(this);
        google::protobuf::UnknownFieldSet::AddVarint(pUVar5,2,(long)(int)local_78);
      }
      goto LAB_007ac8cb;
    }
    if ((iVar2 == 6) && ((p.first & 0xff) == 0x30)) {
      bVar1 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                        (stack0xffffffffffffff98,(int *)&local_7c);
      if (!bVar1) {
        return false;
      }
      bVar1 = SPPParameter_Engine_IsValid(local_7c);
      if (bVar1) {
        set_engine(this,local_7c);
      }
      else {
        pUVar5 = mutable_unknown_fields(this);
        google::protobuf::UnknownFieldSet::AddVarint(pUVar5,6,(long)(int)local_7c);
      }
      goto LAB_007ac8cb;
    }
  }
LAB_007acc03:
  if ((p.first == 0) ||
     (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(p.first),
     input_00 = stack0xffffffffffffff98, tag_00 = p.first, WVar3 == WIRETYPE_END_GROUP)) {
    return true;
  }
  pUVar5 = mutable_unknown_fields(this);
  bVar1 = google::protobuf::internal::WireFormat::SkipField(input_00,tag_00,pUVar5);
joined_r0x007acb29:
  if (!bVar1) {
    return false;
  }
  goto LAB_007ac8cb;
}

Assistant:

bool SPPParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.SPPParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional uint32 pyramid_height = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_pyramid_height();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &pyramid_height_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SPPParameter.PoolMethod pool = 2 [default = MAX];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::SPPParameter_PoolMethod_IsValid(value)) {
            set_pool(static_cast< ::caffe::SPPParameter_PoolMethod >(value));
          } else {
            mutable_unknown_fields()->AddVarint(2, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SPPParameter.Engine engine = 6 [default = DEFAULT];
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::SPPParameter_Engine_IsValid(value)) {
            set_engine(static_cast< ::caffe::SPPParameter_Engine >(value));
          } else {
            mutable_unknown_fields()->AddVarint(6, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.SPPParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.SPPParameter)
  return false;
#undef DO_
}